

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void server::writedemo(int chan,void *data,int len)

{
  long lVar1;
  int stamp [3];
  
  if (demorecord != (long *)0x0) {
    stamp[0] = gamemillis;
    stamp[1] = chan;
    stamp[2] = len;
    (**(code **)(*demorecord + 0x50))(demorecord,stamp,0xc);
    (**(code **)(*demorecord + 0x50))(demorecord,data,len);
    lVar1 = (**(code **)(*demorecord + 0x28))();
    if (maxdemosize << 0x14 <= lVar1) {
      enddemorecord();
    }
  }
  return;
}

Assistant:

void writedemo(int chan, void *data, int len)
    {
        if(!demorecord) return;
        int stamp[3] = { gamemillis, chan, len };
        lilswap(stamp, 3);
        demorecord->write(stamp, sizeof(stamp));
        demorecord->write(data, len);
        if(demorecord->rawtell() >= (maxdemosize<<20)) enddemorecord();
    }